

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.c
# Opt level: O0

int xmllintShellDu(xmllintShellCtxtPtr ctxt,char *arg,xmlNodePtr tree,xmlNodePtr node2)

{
  int local_40;
  int local_3c;
  int i;
  int indent;
  xmlNodePtr node;
  xmlNodePtr node2_local;
  xmlNodePtr tree_local;
  char *arg_local;
  xmllintShellCtxtPtr ctxt_local;
  
  local_3c = 0;
  if (ctxt == (xmllintShellCtxtPtr)0x0) {
    ctxt_local._4_4_ = -1;
  }
  else {
    _i = tree;
    if (tree == (xmlNodePtr)0x0) {
      ctxt_local._4_4_ = -1;
    }
    else {
      while (_i != (xmlNodePtr)0x0) {
        if ((_i->type == XML_DOCUMENT_NODE) || (_i->type == XML_HTML_DOCUMENT_NODE)) {
          fprintf((FILE *)ctxt->output,"/\n");
        }
        else if (_i->type == XML_ELEMENT_NODE) {
          for (local_40 = 0; local_40 < local_3c; local_40 = local_40 + 1) {
            fprintf((FILE *)ctxt->output,"  ");
          }
          if ((_i->ns != (xmlNs *)0x0) && (_i->ns->prefix != (xmlChar *)0x0)) {
            fprintf((FILE *)ctxt->output,"%s:",_i->ns->prefix);
          }
          fprintf((FILE *)ctxt->output,"%s\n",_i->name);
        }
        if ((_i->type == XML_DOCUMENT_NODE) || (_i->type == XML_HTML_DOCUMENT_NODE)) {
          _i = _i->children;
        }
        else if ((_i->children == (_xmlNode *)0x0) || (_i->type == XML_ENTITY_REF_NODE)) {
          if ((_i == tree) || (_i->next == (_xmlNode *)0x0)) {
            if (_i == tree) {
              _i = (xmlNodePtr)0x0;
            }
            else {
              do {
                if (_i == tree) goto LAB_0010e867;
                if (_i->parent != (_xmlNode *)0x0) {
                  _i = _i->parent;
                  local_3c = local_3c + -1;
                }
                if ((_i != tree) && (_i->next != (_xmlNode *)0x0)) {
                  _i = _i->next;
                  goto LAB_0010e867;
                }
                if (_i->parent == (_xmlNode *)0x0) {
                  _i = (xmlNodePtr)0x0;
                  goto LAB_0010e867;
                }
              } while (_i != tree);
              _i = (xmlNodePtr)0x0;
LAB_0010e867:
              if (_i == tree) {
                _i = (xmlNodePtr)0x0;
              }
            }
          }
          else {
            _i = _i->next;
          }
        }
        else {
          _i = _i->children;
          local_3c = local_3c + 1;
        }
      }
      ctxt_local._4_4_ = 0;
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmllintShellDu(xmllintShellCtxtPtr ctxt,
           char *arg ATTRIBUTE_UNUSED, xmlNodePtr tree,
           xmlNodePtr node2 ATTRIBUTE_UNUSED)
{
    xmlNodePtr node;
    int indent = 0, i;

    if (!ctxt)
	return (-1);

    if (tree == NULL)
        return (-1);
    node = tree;
    while (node != NULL) {
        if ((node->type == XML_DOCUMENT_NODE) ||
            (node->type == XML_HTML_DOCUMENT_NODE)) {
            fprintf(ctxt->output, "/\n");
        } else if (node->type == XML_ELEMENT_NODE) {
            for (i = 0; i < indent; i++)
                fprintf(ctxt->output, "  ");
            if ((node->ns) && (node->ns->prefix))
                fprintf(ctxt->output, "%s:", node->ns->prefix);
            fprintf(ctxt->output, "%s\n", node->name);
        } else {
        }

        /*
         * Browse the full subtree, deep first
         */

        if ((node->type == XML_DOCUMENT_NODE) ||
            (node->type == XML_HTML_DOCUMENT_NODE)) {
            node = ((xmlDocPtr) node)->children;
        } else if ((node->children != NULL)
                   && (node->type != XML_ENTITY_REF_NODE)) {
            /* deep first */
            node = node->children;
            indent++;
        } else if ((node != tree) && (node->next != NULL)) {
            /* then siblings */
            node = node->next;
        } else if (node != tree) {
            /* go up to parents->next if needed */
            while (node != tree) {
                if (node->parent != NULL) {
                    node = node->parent;
                    indent--;
                }
                if ((node != tree) && (node->next != NULL)) {
                    node = node->next;
                    break;
                }
                if (node->parent == NULL) {
                    node = NULL;
                    break;
                }
                if (node == tree) {
                    node = NULL;
                    break;
                }
            }
            /* exit condition */
            if (node == tree)
                node = NULL;
        } else
            node = NULL;
    }
    return (0);
}